

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_send_http_ok(mg_connection *conn,char *mime_type,longlong content_length)

{
  char *pcVar1;
  char *header;
  int trunc;
  char len [32];
  int local_3c;
  char local_38 [32];
  
  if ((mime_type == (char *)0x0) || (*mime_type == '\0')) {
    mime_type = "text/html";
  }
  mg_response_header_start(conn,200);
  send_no_cache_header(conn);
  pcVar1 = conn->dom_ctx->config[0x38];
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    mg_response_header_add_lines(conn,pcVar1);
  }
  send_cors_header(conn);
  mg_response_header_add(conn,"Content-Type",mime_type,-1);
  if (content_length < 0) {
    if (conn->protocol_type != 0) goto LAB_0011b902;
    header = "Transfer-Encoding";
    pcVar1 = "chunked";
  }
  else {
    local_3c = 0;
    mg_snprintf(conn,&local_3c,local_38,0x20,"%lu",content_length);
    if (local_3c != 0) goto LAB_0011b902;
    header = "Content-Length";
    pcVar1 = local_38;
  }
  mg_response_header_add(conn,header,pcVar1,-1);
LAB_0011b902:
  mg_response_header_send(conn);
  return 0;
}

Assistant:

CIVETWEB_API int
mg_send_http_ok(struct mg_connection *conn,
                const char *mime_type,
                long long content_length)
{
	if ((mime_type == NULL) || (*mime_type == 0)) {
		/* No content type defined: default to text/html */
		mime_type = "text/html";
	}

	mg_response_header_start(conn, 200);
	send_no_cache_header(conn);
	send_additional_header(conn);
	send_cors_header(conn);
	mg_response_header_add(conn, "Content-Type", mime_type, -1);
	if (content_length < 0) {
		/* Size not known. Use chunked encoding (HTTP/1.x) */
		if (conn->protocol_type == PROTOCOL_TYPE_HTTP1) {
			/* Only HTTP/1.x defines "chunked" encoding, HTTP/2 does not*/
			mg_response_header_add(conn, "Transfer-Encoding", "chunked", -1);
		}
	} else {
		char len[32];
		int trunc = 0;
		mg_snprintf(conn,
		            &trunc,
		            len,
		            sizeof(len),
		            "%" UINT64_FMT,
		            (uint64_t)content_length);
		if (!trunc) {
			/* Since 32 bytes is enough to hold any 64 bit decimal number,
			 * !trunc is always true */
			mg_response_header_add(conn, "Content-Length", len, -1);
		}
	}
	mg_response_header_send(conn);

	return 0;
}